

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_int16 *
ma_dr_mp3__full_read_and_close_s16
          (ma_dr_mp3 *pMP3,ma_dr_mp3_config *pConfig,ma_uint64 *pTotalFrameCount)

{
  uint uVar1;
  ma_int16 *pmVar2;
  ma_dr_mp3 *pmVar3;
  void *p;
  long *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  ma_int16 *pNewFrames;
  ma_uint64 newFramesCap;
  ma_uint64 oldFramesBufferSize;
  ma_uint64 newFramesBufferSize;
  ma_uint64 framesJustRead;
  ma_uint64 framesToReadRightNow;
  ma_int16 temp [4096];
  ma_int16 *pFrames;
  ma_uint64 framesCapacity;
  ma_uint64 totalFramesRead;
  ma_int16 *in_stack_ffffffffffffdf98;
  ma_dr_mp3 *in_stack_ffffffffffffdfa0;
  ma_dr_mp3 *in_stack_ffffffffffffdfa8;
  undefined1 local_2038 [8200];
  ma_int16 *local_30;
  ma_dr_mp3 *local_28;
  long local_20;
  long *local_18;
  undefined4 *local_10;
  long local_8;
  
  local_20 = 0;
  local_28 = (ma_dr_mp3 *)0x0;
  local_30 = (ma_int16 *)0x0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  local_8 = in_RDI;
  do {
    uVar1 = *(uint *)(local_8 + 0x1a0c);
    p = (void *)ma_dr_mp3_read_pcm_frames_s16
                          (in_stack_ffffffffffffdfa8,(ma_uint64)in_stack_ffffffffffffdfa0,
                           in_stack_ffffffffffffdf98);
    if (p == (void *)0x0) break;
    pmVar2 = local_30;
    pmVar3 = local_28;
    if (local_28 < (ma_dr_mp3 *)(local_20 + (long)p)) {
      in_stack_ffffffffffffdfa0 = (ma_dr_mp3 *)((long)local_28 << 1);
      if (in_stack_ffffffffffffdfa0 < (ma_dr_mp3 *)(local_20 + (long)p)) {
        in_stack_ffffffffffffdfa0 = (ma_dr_mp3 *)(local_20 + (long)p);
      }
      in_stack_ffffffffffffdfa8 =
           (ma_dr_mp3 *)((long)local_28 * (ulong)*(uint *)(local_8 + 0x1a0c) * 2);
      in_stack_ffffffffffffdf98 =
           (ma_int16 *)
           ma_dr_mp3__realloc_from_callbacks
                     (p,(long)in_stack_ffffffffffffdfa0 * (ulong)*(uint *)(local_8 + 0x1a0c) * 2,
                      (size_t)in_stack_ffffffffffffdfa8,
                      (ma_allocation_callbacks *)in_stack_ffffffffffffdfa0);
      pmVar2 = in_stack_ffffffffffffdf98;
      pmVar3 = in_stack_ffffffffffffdfa0;
      if (in_stack_ffffffffffffdf98 == (ma_int16 *)0x0) {
        ma_dr_mp3__free_from_callbacks(in_stack_ffffffffffffdfa0,(ma_allocation_callbacks *)0x0);
        break;
      }
    }
    local_28 = pmVar3;
    local_30 = pmVar2;
    memcpy(local_30 + local_20 * (ulong)*(uint *)(local_8 + 0x1a0c),local_2038,
           (long)p * (ulong)*(uint *)(local_8 + 0x1a0c) * 2);
    local_20 = (long)p + local_20;
  } while (p == SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x1000)) / ZEXT416(uVar1),0));
  if (local_10 != (undefined4 *)0x0) {
    *local_10 = *(undefined4 *)(local_8 + 0x1a0c);
    local_10[1] = *(undefined4 *)(local_8 + 0x1a10);
  }
  ma_dr_mp3_uninit(in_stack_ffffffffffffdfa0);
  if (local_18 != (long *)0x0) {
    *local_18 = local_20;
  }
  return local_30;
}

Assistant:

static ma_int16* ma_dr_mp3__full_read_and_close_s16(ma_dr_mp3* pMP3, ma_dr_mp3_config* pConfig, ma_uint64* pTotalFrameCount)
{
    ma_uint64 totalFramesRead = 0;
    ma_uint64 framesCapacity = 0;
    ma_int16* pFrames = NULL;
    ma_int16 temp[4096];
    MA_DR_MP3_ASSERT(pMP3 != NULL);
    for (;;) {
        ma_uint64 framesToReadRightNow = MA_DR_MP3_COUNTOF(temp) / pMP3->channels;
        ma_uint64 framesJustRead = ma_dr_mp3_read_pcm_frames_s16(pMP3, framesToReadRightNow, temp);
        if (framesJustRead == 0) {
            break;
        }
        if (framesCapacity < totalFramesRead + framesJustRead) {
            ma_uint64 newFramesBufferSize;
            ma_uint64 oldFramesBufferSize;
            ma_uint64 newFramesCap;
            ma_int16* pNewFrames;
            newFramesCap = framesCapacity * 2;
            if (newFramesCap < totalFramesRead + framesJustRead) {
                newFramesCap = totalFramesRead + framesJustRead;
            }
            oldFramesBufferSize = framesCapacity * pMP3->channels * sizeof(ma_int16);
            newFramesBufferSize = newFramesCap   * pMP3->channels * sizeof(ma_int16);
            if (newFramesBufferSize > (ma_uint64)MA_SIZE_MAX) {
                break;
            }
            pNewFrames = (ma_int16*)ma_dr_mp3__realloc_from_callbacks(pFrames, (size_t)newFramesBufferSize, (size_t)oldFramesBufferSize, &pMP3->allocationCallbacks);
            if (pNewFrames == NULL) {
                ma_dr_mp3__free_from_callbacks(pFrames, &pMP3->allocationCallbacks);
                break;
            }
            pFrames = pNewFrames;
            framesCapacity = newFramesCap;
        }
        MA_DR_MP3_COPY_MEMORY(pFrames + totalFramesRead*pMP3->channels, temp, (size_t)(framesJustRead*pMP3->channels*sizeof(ma_int16)));
        totalFramesRead += framesJustRead;
        if (framesJustRead != framesToReadRightNow) {
            break;
        }
    }
    if (pConfig != NULL) {
        pConfig->channels   = pMP3->channels;
        pConfig->sampleRate = pMP3->sampleRate;
    }
    ma_dr_mp3_uninit(pMP3);
    if (pTotalFrameCount) {
        *pTotalFrameCount = totalFramesRead;
    }
    return pFrames;
}